

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O2

uint32_t find_firstassertedcu(PCRE2_SPTR16 code,int32_t *flags,uint32_t inassert)

{
  int iVar1;
  ushort uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  PCRE2_UCHAR16 *code_00;
  ulong uVar5;
  int iVar6;
  uint32_t uVar7;
  int dflags;
  int32_t *local_38;
  
  *flags = -1;
  uVar2 = *code;
  uVar7 = 0;
  iVar6 = -1;
  local_38 = flags;
  do {
    if ((5 < uVar2 - 0x85) || (uVar5 = 1, (0x23U >> (uVar2 - 0x85 & 0x1f) & 1) == 0)) {
      uVar5 = (ulong)(uVar2 == 0x8b);
    }
    code_00 = first_significant_code(code + uVar5 + 2,1);
    uVar2 = *code_00;
    if ((uVar2 - 0x7e < 0xe) && ((0x31f1U >> (uVar2 - 0x7e & 0x1f) & 1) != 0)) {
      uVar3 = find_firstassertedcu(code_00,&dflags,(uVar2 == 0x7e) + inassert);
      if (dflags < 0) {
        return 0;
      }
      iVar1 = dflags;
      if (-1 < iVar6) {
        if (uVar7 != uVar3) {
          return 0;
        }
        iVar1 = iVar6;
        uVar3 = uVar7;
        if (iVar6 != dflags) {
          return 0;
        }
      }
    }
    else {
      if (uVar2 - 0x23 < 2) {
LAB_00128106:
        if (inassert == 0) {
          return 0;
        }
        uVar4 = (uint32_t)code_00[1];
        if (iVar6 < 0) {
          iVar1 = 0;
          uVar3 = uVar4;
          goto LAB_00128136;
        }
      }
      else {
        if (1 < uVar2 - 0x30) {
          if (uVar2 != 0x1d) {
            if (uVar2 == 0x1e) goto LAB_0012811c;
            if (uVar2 == 0x29) {
              code_00 = code_00 + 1;
            }
            else if (uVar2 != 0x2b) {
              if (uVar2 == 0x36) {
                code_00 = code_00 + 1;
              }
              else if (uVar2 != 0x38) {
                return 0;
              }
              goto LAB_0012811c;
            }
          }
          goto LAB_00128106;
        }
LAB_0012811c:
        if (inassert == 0) {
          return 0;
        }
        uVar4 = (uint32_t)code_00[1];
        if (iVar6 < 0) {
          iVar1 = 1;
          uVar3 = uVar4;
          goto LAB_00128136;
        }
      }
      iVar1 = iVar6;
      uVar3 = uVar7;
      if (uVar7 != uVar4) {
        return 0;
      }
    }
LAB_00128136:
    uVar7 = uVar3;
    iVar6 = iVar1;
    code = code + code[1];
    uVar2 = 0x78;
    if (*code != 0x78) {
      *local_38 = iVar6;
      return uVar7;
    }
  } while( true );
}

Assistant:

static uint32_t
find_firstassertedcu(PCRE2_SPTR code, int32_t *flags, uint32_t inassert)
{
uint32_t c = 0;
int cflags = REQ_NONE;

*flags = REQ_NONE;
do {
   uint32_t d;
   int dflags;
   int xl = (*code == OP_CBRA || *code == OP_SCBRA ||
             *code == OP_CBRAPOS || *code == OP_SCBRAPOS)? IMM2_SIZE:0;
   PCRE2_SPTR scode = first_significant_code(code + 1+LINK_SIZE + xl, TRUE);
   PCRE2_UCHAR op = *scode;

   switch(op)
     {
     default:
     return 0;

     case OP_BRA:
     case OP_BRAPOS:
     case OP_CBRA:
     case OP_SCBRA:
     case OP_CBRAPOS:
     case OP_SCBRAPOS:
     case OP_ASSERT:
     case OP_ONCE:
     d = find_firstassertedcu(scode, &dflags, inassert + ((op==OP_ASSERT)?1:0));
     if (dflags < 0)
       return 0;
     if (cflags < 0) { c = d; cflags = dflags; }
       else if (c != d || cflags != dflags) return 0;
     break;

     case OP_EXACT:
     scode += IMM2_SIZE;
     /* Fall through */

     case OP_CHAR:
     case OP_PLUS:
     case OP_MINPLUS:
     case OP_POSPLUS:
     if (inassert == 0) return 0;
     if (cflags < 0) { c = scode[1]; cflags = 0; }
       else if (c != scode[1]) return 0;
     break;

     case OP_EXACTI:
     scode += IMM2_SIZE;
     /* Fall through */

     case OP_CHARI:
     case OP_PLUSI:
     case OP_MINPLUSI:
     case OP_POSPLUSI:
     if (inassert == 0) return 0;
     if (cflags < 0) { c = scode[1]; cflags = REQ_CASELESS; }
       else if (c != scode[1]) return 0;
     break;
     }

   code += GET(code, 1);
   }
while (*code == OP_ALT);

*flags = cflags;
return c;
}